

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall google::protobuf::internal::DynamicMapField::~DynamicMapField(DynamicMapField *this)

{
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>_3
  *this_00;
  NodeBase *pNVar1;
  Arena *pAVar2;
  string *psVar3;
  ClearInput input;
  iterator __begin2;
  UntypedMapIterator local_30;
  
  pAVar2 = MapFieldBase::arena((MapFieldBase *)this);
  if (pAVar2 != (Arena *)0x0) {
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (pAVar2,(void *)0x0,"arena() == nullptr");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/map_field.cc"
               ,0x1af,*(undefined8 *)(psVar3 + 8),*(undefined8 *)psVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  this_00 = &(this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .field_0;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
            ((iterator *)&local_30,&this_00->map_);
  if (local_30.node_ != (NodeBase *)0x0) {
    do {
      MapValueRef::DeleteData((MapValueRef *)(local_30.node_ + 6));
      pNVar1 = (local_30.node_)->next;
      if ((local_30.node_)->next == (NodeBase *)0x0) {
        UntypedMapIterator::SearchFrom(&local_30,local_30.bucket_index_ + 1);
        pNVar1 = local_30.node_;
      }
      local_30.node_ = pNVar1;
    } while (local_30.node_ != (NodeBase *)0x0);
  }
  if ((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .field_0.map_.super_KeyMapBase<google::protobuf::MapKey>.super_UntypedMapBase.num_buckets_ !=
      1) {
    input.destroy_node =
         UntypedMapBase::
         DestroyNode<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::Node>
    ;
    input.size_info = 0x400030;
    input.destroy_bits = '\b';
    input.reset_table = true;
    input._6_2_ = 0;
    UntypedMapBase::ClearTable((UntypedMapBase *)&this_00->map_,input);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::~Map(&this_00->map_);
  MapFieldBase::~MapFieldBase((MapFieldBase *)this);
  return;
}

Assistant:

DynamicMapField::~DynamicMapField() {
  ABSL_DCHECK_EQ(arena(), nullptr);
  // DynamicMapField owns map values. Need to delete them before clearing the
  // map.
  for (auto& kv : map_) {
    kv.second.DeleteData();
  }
  map_.clear();
}